

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O1

void Aig_ManDump(Aig_Man_t *p)

{
  char FileName [200];
  char acStack_d8 [200];
  
  Aig_ManDump::Counter = Aig_ManDump::Counter + 1;
  sprintf(acStack_d8,"aigbug\\%03d.blif");
  Aig_ManDumpBlif(p,acStack_d8,(Vec_Ptr_t *)0x0,(Vec_Ptr_t *)0x0);
  printf("Intermediate AIG with %d nodes was written into file \"%s\".\n",
         (ulong)(uint)(p->nObjs[6] + p->nObjs[5]),acStack_d8);
  return;
}

Assistant:

void Aig_ManDump( Aig_Man_t * p )
{ 
    static int Counter = 0;
    char FileName[200];
    // dump the logic into a file
    sprintf( FileName, "aigbug\\%03d.blif", ++Counter );
    Aig_ManDumpBlif( p, FileName, NULL, NULL );
    printf( "Intermediate AIG with %d nodes was written into file \"%s\".\n", Aig_ManNodeNum(p), FileName );
}